

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O3

void __thiscall
llvm::detail::IEEEFloat::IEEEFloat(IEEEFloat *this,fltSemantics *ourSemantics,integerPart value)

{
  Significand *dst;
  uint uVar1;
  Significand *pSVar2;
  
  this->semantics = ourSemantics;
  uVar1 = ourSemantics->precision + 0x40;
  if (uVar1 < 0x80) {
    dst = (Significand *)(this->significand).parts;
  }
  else {
    dst = (Significand *)operator_new__((ulong)(uVar1 >> 3 & 0xfffffff8));
    (this->significand).parts = (integerPart *)dst;
  }
  this->field_0x12 = this->field_0x12 & 0xf0 | 2;
  pSVar2 = &this->significand;
  if (0xffffff7f < ourSemantics->precision - 0x40) {
    dst = pSVar2;
  }
  APInt::tcSet(&dst->part,0,ourSemantics->precision + 0x40 >> 6);
  this->exponent = (short)ourSemantics->precision + -1;
  if (this->semantics->precision - 0x40 < 0xffffff80) {
    pSVar2 = (Significand *)(this->significand).parts;
  }
  pSVar2->part = value;
  normalize(this,rmNearestTiesToEven,lfExactlyZero);
  return;
}

Assistant:

IEEEFloat::IEEEFloat(const fltSemantics &ourSemantics, integerPart value) {
  initialize(&ourSemantics);
  sign = 0;
  category = fcNormal;
  zeroSignificand();
  exponent = ourSemantics.precision - 1;
  significandParts()[0] = value;
  normalize(rmNearestTiesToEven, lfExactlyZero);
}